

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

void __thiscall
helics::CommonCore::sendToAt
          (CommonCore *this,InterfaceHandle sourceHandle,void *data,uint64_t length,
          string_view destination,Time sendTime)

{
  atomic<int> *paVar1;
  int iVar2;
  string_view string3;
  pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_> *ppVar3;
  bool bVar4;
  _Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_true>
  *p_Var5;
  FederateState *this_00;
  InvalidIdentifier *this_01;
  InvalidParameter *this_02;
  char *pcVar6;
  __normal_iterator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_*,_std::vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
  __it;
  long lVar7;
  long lVar8;
  __normal_iterator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_*,_std::vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
  _Var9;
  string_view message_00;
  string_view message_01;
  string_view string2;
  size_t sStackY_170;
  size_t local_108;
  char *local_100;
  size_t local_f8;
  char *pcStack_f0;
  ActionMessage message;
  
  if (destination._M_len == 0) {
    sendAt(this,sourceHandle,data,length,sendTime);
    return;
  }
  p_Var5 = getHandleInfo(this,sourceHandle);
  if (p_Var5 == (_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_true>
                 *)0x0) {
    this_01 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
    pcVar6 = "handle is not valid";
    sStackY_170 = 0x13;
LAB_00289185:
    message_00._M_str = pcVar6;
    message_00._M_len = sStackY_170;
    InvalidIdentifier::InvalidIdentifier(this_01,message_00);
    __cxa_throw(this_01,&InvalidIdentifier::typeinfo,HelicsException::~HelicsException);
  }
  if ((p_Var5->
      super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_true>
      ).
      super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>_>
      ._M_storage._M_storage.__data[4] != 'e') {
    this_01 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
    pcVar6 = "handle does not point to an endpoint";
    sStackY_170 = 0x24;
    goto LAB_00289185;
  }
  this_00 = getFederateAt(this,(LocalFederateId)
                               *(BaseType *)
                                &(p_Var5->
                                 super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_true>
                                 ).
                                 super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>_>
                                 ._M_storage._M_storage);
  if (((p_Var5->
       super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_true>
       ).
       super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>_>
       ._M_storage._M_storage.__data[7] & 4) == 0) goto LAB_00289051;
  FederateState::getMessageDestinations
            ((vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
              *)&message,this_00,sourceHandle);
  __it._M_current =
       (pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_> *)
       CONCAT44(message.messageID,message.messageAction);
  ppVar3 = (pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_> *)
           CONCAT44(message.source_handle.hid,message.source_id.gid);
  lVar8 = (long)ppVar3 - (long)__it._M_current;
  local_108 = destination._M_len;
  local_100 = destination._M_str;
  for (lVar7 = lVar8 / 0x18 >> 2; 0 < lVar7; lVar7 = lVar7 + -1) {
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<helics::CommonCore::sendToAt(helics::InterfaceHandle,void_const*,unsigned_long,std::basic_string_view<char,std::char_traits<char>>,TimeRepresentation<count_time<9,long>>)::$_0>
            ::operator()((_Iter_pred<helics::CommonCore::sendToAt(helics::InterfaceHandle,void_const*,unsigned_long,std::basic_string_view<char,std::char_traits<char>>,TimeRepresentation<count_time<9,long>>)::__0>
                          *)&local_108,__it);
    _Var9._M_current = __it._M_current;
    if (bVar4) goto LAB_00289031;
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<helics::CommonCore::sendToAt(helics::InterfaceHandle,void_const*,unsigned_long,std::basic_string_view<char,std::char_traits<char>>,TimeRepresentation<count_time<9,long>>)::$_0>
            ::operator()((_Iter_pred<helics::CommonCore::sendToAt(helics::InterfaceHandle,void_const*,unsigned_long,std::basic_string_view<char,std::char_traits<char>>,TimeRepresentation<count_time<9,long>>)::__0>
                          *)&local_108,__it._M_current + 1);
    _Var9._M_current = __it._M_current + 1;
    if (bVar4) goto LAB_00289031;
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<helics::CommonCore::sendToAt(helics::InterfaceHandle,void_const*,unsigned_long,std::basic_string_view<char,std::char_traits<char>>,TimeRepresentation<count_time<9,long>>)::$_0>
            ::operator()((_Iter_pred<helics::CommonCore::sendToAt(helics::InterfaceHandle,void_const*,unsigned_long,std::basic_string_view<char,std::char_traits<char>>,TimeRepresentation<count_time<9,long>>)::__0>
                          *)&local_108,__it._M_current + 2);
    _Var9._M_current = __it._M_current + 2;
    if (bVar4) goto LAB_00289031;
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<helics::CommonCore::sendToAt(helics::InterfaceHandle,void_const*,unsigned_long,std::basic_string_view<char,std::char_traits<char>>,TimeRepresentation<count_time<9,long>>)::$_0>
            ::operator()((_Iter_pred<helics::CommonCore::sendToAt(helics::InterfaceHandle,void_const*,unsigned_long,std::basic_string_view<char,std::char_traits<char>>,TimeRepresentation<count_time<9,long>>)::__0>
                          *)&local_108,__it._M_current + 3);
    _Var9._M_current = __it._M_current + 3;
    if (bVar4) goto LAB_00289031;
    __it._M_current = __it._M_current + 4;
    lVar8 = lVar8 + -0x60;
  }
  lVar8 = lVar8 / 0x18;
  if (lVar8 == 1) {
LAB_0028913e:
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<helics::CommonCore::sendToAt(helics::InterfaceHandle,void_const*,unsigned_long,std::basic_string_view<char,std::char_traits<char>>,TimeRepresentation<count_time<9,long>>)::$_0>
            ::operator()((_Iter_pred<helics::CommonCore::sendToAt(helics::InterfaceHandle,void_const*,unsigned_long,std::basic_string_view<char,std::char_traits<char>>,TimeRepresentation<count_time<9,long>>)::__0>
                          *)&local_108,__it);
    _Var9._M_current = ppVar3;
    if (bVar4) {
      _Var9._M_current = __it._M_current;
    }
  }
  else if (lVar8 == 2) {
LAB_00289005:
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<helics::CommonCore::sendToAt(helics::InterfaceHandle,void_const*,unsigned_long,std::basic_string_view<char,std::char_traits<char>>,TimeRepresentation<count_time<9,long>>)::$_0>
            ::operator()((_Iter_pred<helics::CommonCore::sendToAt(helics::InterfaceHandle,void_const*,unsigned_long,std::basic_string_view<char,std::char_traits<char>>,TimeRepresentation<count_time<9,long>>)::__0>
                          *)&local_108,__it);
    _Var9._M_current = __it._M_current;
    if (!bVar4) {
      __it._M_current = __it._M_current + 1;
      goto LAB_0028913e;
    }
  }
  else {
    _Var9._M_current = ppVar3;
    if ((lVar8 == 3) &&
       (bVar4 = __gnu_cxx::__ops::
                _Iter_pred<helics::CommonCore::sendToAt(helics::InterfaceHandle,void_const*,unsigned_long,std::basic_string_view<char,std::char_traits<char>>,TimeRepresentation<count_time<9,long>>)::$_0>
                ::operator()((_Iter_pred<helics::CommonCore::sendToAt(helics::InterfaceHandle,void_const*,unsigned_long,std::basic_string_view<char,std::char_traits<char>>,TimeRepresentation<count_time<9,long>>)::__0>
                              *)&local_108,__it), _Var9._M_current = __it._M_current, !bVar4)) {
      __it._M_current = __it._M_current + 1;
      goto LAB_00289005;
    }
  }
LAB_00289031:
  if (_Var9._M_current ==
      (pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_> *)
      CONCAT44(message.source_handle.hid,message.source_id.gid)) {
    this_02 = (InvalidParameter *)__cxa_allocate_exception(0x28);
    message_01._M_str = "targeted endpoint destination not in target list";
    message_01._M_len = 0x30;
    InvalidParameter::InvalidParameter(this_02,message_01);
    __cxa_throw(this_02,&InvalidParameter::typeinfo,HelicsException::~HelicsException);
  }
  std::
  _Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  ::~_Vector_base((_Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                   *)&message);
LAB_00289051:
  ActionMessage::ActionMessage(&message,cmd_send_message);
  LOCK();
  paVar1 = &this->messageCounter;
  iVar2 = (paVar1->super___atomic_base<int>)._M_i;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  message.messageID = iVar2 + 1;
  message.source_id.gid = *(BaseType *)&(p_Var5->super__Hash_node_base)._M_nxt;
  lVar8 = (this_00->allowed_send_time).internalTimeCode;
  message.actionTime.internalTimeCode = sendTime.internalTimeCode;
  if (sendTime.internalTimeCode < lVar8) {
    message.actionTime.internalTimeCode = lVar8;
  }
  message.flags =
       *(uint16_t *)
        ((long)&(p_Var5->
                super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_true>
                ).
                super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>_>
                ._M_storage._M_storage + 6);
  message.source_handle.hid = sourceHandle.hid;
  SmallBuffer::assign(&message.payload,data,length);
  pcStack_f0 = *(char **)((long)&(p_Var5->
                                 super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_true>
                                 ).
                                 super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>_>
                                 ._M_storage._M_storage + 8);
  local_f8 = *(size_t *)
              ((long)&(p_Var5->
                      super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_true>
                      ).
                      super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>_>
                      ._M_storage._M_storage + 0x10);
  string3._M_str = pcStack_f0;
  string3._M_len = local_f8;
  string2._M_str = pcStack_f0;
  string2._M_len = local_f8;
  ActionMessage::setStringData(&message,destination,string2,string3);
  BrokerBase::addActionMessage(&this->super_BrokerBase,&message);
  ActionMessage::~ActionMessage(&message);
  return;
}

Assistant:

void CommonCore::sendToAt(InterfaceHandle sourceHandle,
                          const void* data,
                          uint64_t length,
                          std::string_view destination,
                          Time sendTime)
{
    if (destination.empty()) {
        // sendToAt should be the equivalent of sendAt if there is an empty destination
        sendAt(sourceHandle, data, length, sendTime);
        return;
    }
    const auto* hndl = getHandleInfo(sourceHandle);
    if (hndl == nullptr) {
        throw(InvalidIdentifier("handle is not valid"));
    }

    if (hndl->handleType != InterfaceType::ENDPOINT) {
        throw(InvalidIdentifier("handle does not point to an endpoint"));
    }
    auto* fed = getFederateAt(hndl->local_fed_id);
    if (checkActionFlag(*hndl, targeted_flag)) {
        auto targets = fed->getMessageDestinations(sourceHandle);
        auto res = std::find_if(targets.begin(), targets.end(), [destination](const auto& val) {
            return (val.second == destination);
        });
        if (res == targets.end()) {
            throw(InvalidParameter("targeted endpoint destination not in target list"));
        }
    }

    ActionMessage message(CMD_SEND_MESSAGE);

    message.messageID = ++messageCounter;
    message.source_handle = sourceHandle;
    message.source_id = hndl->getFederateId();
    auto minTime = fed->nextAllowedSendTime();
    message.actionTime = std::max(sendTime, minTime);
    message.flags = hndl->flags;

    message.payload.assign(data, length);
    message.setStringData(destination, hndl->key, hndl->key);

    addActionMessage(std::move(message));
}